

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.cpp
# Opt level: O2

char * mz_error(int err)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x10 == 0xb0) {
      return (char *)0x0;
    }
    lVar1 = lVar2 + 0x10;
  } while (*(int *)((long)&mz_error::s_error_descs[0].m_err + lVar2) != err);
  return *(char **)((long)&mz_error::s_error_descs[0].m_pDesc + lVar2);
}

Assistant:

const char *mz_error(int err)
{
    static struct
    {
        int m_err;
        const char *m_pDesc;
    } s_error_descs[] = {{MZ_OK, ""},
                         {MZ_STREAM_END, "stream end"},
                         {MZ_NEED_DICT, "need dictionary"},
                         {MZ_ERRNO, "file error"},
                         {MZ_STREAM_ERROR, "stream error"},
                         {MZ_DATA_ERROR, "data error"},
                         {MZ_MEM_ERROR, "out of memory"},
                         {MZ_BUF_ERROR, "buf error"},
                         {MZ_VERSION_ERROR, "version error"},
                         {MZ_PARAM_ERROR, "parameter error"}};
    mz_uint i;
    for (i = 0; i < sizeof(s_error_descs) / sizeof(s_error_descs[0]); ++i)
        if (s_error_descs[i].m_err == err)
            return s_error_descs[i].m_pDesc;
    return NULL;
}